

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

void arinvtrans(int p,double *old,double *new1)

{
  void *__ptr;
  double dVar1;
  double *temp;
  double a;
  int k;
  int j;
  double *new1_local;
  double *old_local;
  int p_local;
  
  __ptr = malloc((long)p << 3);
  for (a._4_4_ = 0; a._4_4_ < p; a._4_4_ = a._4_4_ + 1) {
    dVar1 = old[a._4_4_];
    new1[a._4_4_] = dVar1;
    *(double *)((long)__ptr + (long)a._4_4_ * 8) = dVar1;
  }
  for (a._4_4_ = p + -1; 0 < a._4_4_; a._4_4_ = a._4_4_ + -1) {
    dVar1 = new1[a._4_4_];
    for (a._0_4_ = 0; a._0_4_ < a._4_4_; a._0_4_ = a._0_4_ + 1) {
      *(double *)((long)__ptr + (long)a._0_4_ * 8) =
           (dVar1 * new1[(a._4_4_ - a._0_4_) + -1] + new1[a._0_4_]) / (-dVar1 * dVar1 + 1.0);
    }
    for (a._0_4_ = 0; a._0_4_ < a._4_4_; a._0_4_ = a._0_4_ + 1) {
      new1[a._0_4_] = *(double *)((long)__ptr + (long)a._0_4_ * 8);
    }
  }
  for (a._4_4_ = 0; a._4_4_ < p; a._4_4_ = a._4_4_ + 1) {
    dVar1 = atanh(new1[a._4_4_]);
    new1[a._4_4_] = dVar1;
  }
  free(__ptr);
  return;
}

Assistant:

void arinvtrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		temp[j] = new1[j] = old[j];
	}

	for (j = p - 1; j > 0; --j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] = (new1[k] + a * new1[j - k - 1]) / (1 - a * a);
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	for (j = 0; j < p; ++j) {
		new1[j] = atanh(new1[j]);
	}
	free(temp);
}